

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_extraction_by_swipe.cc
# Opt level: O3

bool __thiscall
sptk::PitchExtractionBySwipe::Get
          (PitchExtractionBySwipe *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<double,_std::allocator<double>_> *epochs,Polarity *polarity)

{
  pointer pdVar1;
  pointer pdVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  double *__src;
  pointer pdVar9;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector vVar16;
  
  if ((this->is_valid_ == true) &&
     ((waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar10 = true;
    if (f0 != (vector<double,_std::allocator<double>_> *)0x0) {
      vVar16 = swipe::swipe(waveform,this->sampling_rate_,this->lower_f0_,this->upper_f0_,
                            this->voicing_threshold_,
                            (double)this->frame_shift_ / this->sampling_rate_);
      __src = vVar16.v;
      lVar6 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      lVar7 = lVar6 >> 3;
      auVar12._8_4_ = (int)(lVar6 >> 0x23);
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = 0x45300000;
      dVar11 = ceil(((auVar12._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) /
                    (double)this->frame_shift_);
      uVar5 = (uint)dVar11;
      uVar3 = vVar16.x;
      if ((int)uVar5 <= vVar16.x) {
        uVar3 = uVar5;
      }
      std::vector<double,_std::allocator<double>_>::resize(f0,(long)(int)uVar5);
      lVar6 = (long)(int)uVar3;
      if (uVar3 != 0) {
        memmove((f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,__src,lVar6 * 8);
      }
      auVar4 = _DAT_0012aa40;
      auVar12 = _DAT_0012aa30;
      pdVar1 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar9 = pdVar1 + lVar6;
      if (pdVar9 != pdVar2) {
        dVar11 = __src[lVar6 + -1];
        uVar8 = (long)pdVar2 + (-8 - (long)pdVar9);
        auVar15._8_4_ = (int)uVar8;
        auVar15._0_8_ = uVar8;
        auVar15._12_4_ = (int)(uVar8 >> 0x20);
        auVar13._0_8_ = uVar8 >> 3;
        auVar13._8_8_ = auVar15._8_8_ >> 3;
        pdVar9 = (pointer)0x0;
        auVar13 = auVar13 ^ _DAT_0012aa40;
        do {
          auVar14._8_4_ = (int)pdVar9;
          auVar14._0_8_ = pdVar9;
          auVar14._12_4_ = (int)((ulong)pdVar9 >> 0x20);
          auVar15 = (auVar14 | auVar12) ^ auVar4;
          if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                      auVar13._4_4_ < auVar15._4_4_) & 1)) {
            pdVar1[lVar6 + (long)pdVar9] = dVar11;
          }
          if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
              auVar15._12_4_ <= auVar13._12_4_) {
            pdVar1[(long)pdVar9 + lVar6 + 1] = dVar11;
          }
          pdVar9 = (pointer)((long)pdVar9 + 2);
        } while ((pointer)((uVar8 >> 3) + 2 & 0xfffffffffffffffe) != pdVar9);
      }
      vVar16.v = pdVar9;
      vVar16._0_8_ = __src;
      swipe::freev((swipe *)(ulong)uVar3,vVar16);
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool PitchExtractionBySwipe::Get(
    const std::vector<double>& waveform, std::vector<double>* f0,
    std::vector<double>* epochs,
    PitchExtractionInterface::Polarity* polarity) const {
  // Check inputs.
  if (!is_valid_ || waveform.empty()) {
    return false;
  }

  if (NULL != f0) {
    swipe::vector tmp_f0(swipe::swipe(
        waveform, sampling_rate_, lower_f0_, upper_f0_, voicing_threshold_,
        static_cast<double>(frame_shift_) / sampling_rate_));
    const int target_length(static_cast<int>(
        std::ceil(static_cast<double>(waveform.size()) / frame_shift_)));
    if (target_length < tmp_f0.x) {
      tmp_f0.x = target_length;
    }
    f0->resize(target_length);
    std::copy(tmp_f0.v, tmp_f0.v + tmp_f0.x, f0->begin());
    std::fill(f0->begin() + tmp_f0.x, f0->end(), tmp_f0.v[tmp_f0.x - 1]);
    swipe::freev(tmp_f0);
  }

  if (NULL != epochs) {
    // nothing to do
  }

  if (NULL != polarity) {
    // nothing to do
  }

  return true;
}